

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

bool __thiscall Polymer::CheckTermination(Polymer *this,int pol_index)

{
  MobileElementManager *this_00;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  pointer pIVar4;
  bool bVar5;
  __type _Var6;
  bool bVar7;
  SpeciesTracker *this_01;
  int iVar8;
  pointer pIVar9;
  int i;
  int iVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  Ptr pol;
  Ptr transcript;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  results;
  __shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = &this->polymerases_;
  MobileElementManager::GetPol((MobileElementManager *)&pol,(int)this_00);
  if ((pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->stop_ <
      this->stop_) {
    results.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    results.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
              (&this->release_sites_,
               (long)(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     start_,
               (long)(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     stop_,&results);
    pIVar4 = results.
             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar9 = results.
             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar7 = pIVar9 != pIVar4;
      if (pIVar9 == pIVar4) goto LAB_00117669;
      bVar5 = ReleaseSite::CheckInteraction
                        ((pIVar9->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,&(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->name_,
                         (pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->reading_frame_);
      if ((bVar5) &&
         ((((pIVar9->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_FixedElement).field_0x9d == '\0')) {
        std::__cxx11::string::string
                  ((string *)&transcript,
                   (string *)
                   &(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    gene_bound_);
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&transcript,
                                &(((pIVar9->value).
                                   super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->super_FixedElement).gene_);
        std::__cxx11::string::~string((string *)&transcript);
        if (_Var6) {
          Random::random();
          dVar11 = ReleaseSite::efficiency
                             ((pIVar9->value).
                              super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->name_);
          peVar2 = (pIVar9->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (extraout_XMM0_Qa <= dVar11) {
            iVar8 = (peVar2->super_FixedElement).stop_;
            iVar1 = (pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    stop_;
            MobileElementManager::GetAttached((MobileElementManager *)&transcript,(int)this_00);
            if (transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              for (iVar10 = 0; iVar10 <= iVar8 - iVar1; iVar10 = iVar10 + 1) {
                (*(transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_Polymer[2])();
              }
              (transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->attached_
                   = false;
            }
            std::__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_40,&this->wrapper_);
            Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::Emit(&this->termination_signal_,(shared_ptr<PolymerWrapper> *)&local_40,
                   &(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    name_,&(((pIVar9->value).
                             super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           super_FixedElement).gene_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
            MobileElementManager::Delete(this_00,pol_index);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
LAB_00117669:
            std::
            vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
            ::~vector(&results);
            goto LAB_00117673;
          }
          iVar8 = (peVar2->super_FixedElement).covered_ + 1;
          (peVar2->super_FixedElement).covered_ = iVar8;
          (peVar2->super_FixedElement).old_covered_ = iVar8;
          (peVar2->super_FixedElement).field_0x9d = 1;
        }
      }
      pIVar9 = pIVar9 + 1;
    } while( true );
  }
  bVar7 = std::operator==(&(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->name_,"__rnase");
  if (bVar7) {
    MobileElementManager::Delete(this_00,pol_index);
    this->degrade_ = true;
  }
  else {
    if ((pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        polymerasereadthrough_ != true) {
      std::__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,&this->wrapper_);
      std::__cxx11::string::string((string *)&transcript,"NA",(allocator *)&results);
      Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::Emit(&this->termination_signal_,(shared_ptr<PolymerWrapper> *)&local_70,
             &(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&transcript);
      std::__cxx11::string::~string((string *)&transcript);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      bVar7 = true;
      MobileElementManager::Delete(this_00,pol_index);
      goto LAB_00117673;
    }
    std::__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&this->wrapper_);
    peVar3 = pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&transcript,"NA",(allocator *)&results);
    Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Emit(&this->termination_signal_,(shared_ptr<PolymerWrapper> *)&local_50,&peVar3->name_,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&transcript);
    std::__cxx11::string::~string((string *)&transcript);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    MobileElementManager::Delete(this_00,pol_index);
    this_01 = SpeciesTracker::Instance();
    SpeciesTracker::Increment
              (this_01,&(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        name_,-1);
    std::__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)&transcript,"readthrough",(allocator *)&results);
    (*this->_vptr_Polymer[1])(this,&local_60,&transcript);
    std::__cxx11::string::~string((string *)&transcript);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  bVar7 = true;
LAB_00117673:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar7;
}

Assistant:

bool Polymer::CheckTermination(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index);
  if (pol->stop() >= stop_) {
    if (pol->name() == "__rnase") {
      // std::cout << "rnase ran off end of transcript" << std::endl;
      polymerases_.Delete(pol_index);
      degrade_ = true;
      return true;
    } else if (pol->polymerasereadthrough()) {
      // Create a new transcript and unbind/rebind pol so that
      // all necessary checks still occur
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      // The termination signal increments the pol count by 1,
      // so decrement it here since the polymerase was actually
      // just moved to the beginning of the genome
      SpeciesTracker::Instance().Increment(pol->name(), -1);
      Bind(pol, "readthrough"); 
      return true;
    } else {
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      return true;
    }
  }
  std::vector<Interval<ReleaseSite::Ptr>> results;
  release_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    if (interval.value->CheckInteraction(pol->name(), pol->reading_frame()) &&
        !interval.value->readthrough() &&
        pol->gene_bound() == interval.value->gene()) {
      // terminate
      // std::cout << pol->name() + " " + interval.value->name() << std::endl;
      double random_num = Random::random();
      if (random_num <= interval.value->efficiency(pol->name())) {
        // std::cout << pol->name() + " terminating" << std::endl;
        // Fire Emit signal until entire terminator is uncovered
        // Coordinates are inclusive, so must add 1 after calculating
        // difference
        int dist = interval.value->stop() - pol->stop() + 1;
        auto transcript = polymerases_.GetAttached(pol_index);
        if (transcript != nullptr) {
          for (int i = 0; i < dist; i++) {
            transcript->ShiftMask();
          }
          transcript->attached(false);
        }
        termination_signal_.Emit(wrapper(), pol->name(),
                                 interval.value->gene());
        polymerases_.Delete(pol_index);
        return true;
      } else {
        interval.value->Cover();
        interval.value->ResetState();
        // std::cout << "Readthrough set to true!" << std::endl;
        interval.value->readthrough(true);
      }
    }
  }
  return false;
}